

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflenetv2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  Layer *pLVar3;
  ulong uVar4;
  int i;
  int iVar5;
  ulong uVar6;
  long lVar7;
  vector<float,_std::allocator<float>_> cls_scores;
  Extractor ex;
  Net shufflenetv2;
  Mat out;
  ParamDict pd;
  float norm_vals [3];
  Mat in;
  Mat m;
  int local_70;
  int local_6c;
  uchar *local_68;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&shufflenetv2,pcVar1,(allocator *)&in);
    cv::imread((string *)&m,(int)&shufflenetv2);
    std::__cxx11::string::~string((string *)&shufflenetv2);
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&shufflenetv2);
      shufflenetv2.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&shufflenetv2,"shufflenet_v2_x0.5.param");
      ncnn::Net::load_model(&shufflenetv2,"shufflenet_v2_x0.5.bin");
      ncnn::Mat::from_pixels_resize(&in,local_68,2,local_6c,local_70,0xe0,0xe0,(Allocator *)0x0);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&in,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&in);
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize._0_4_ = 0;
      out._20_8_ = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out.h = 0;
      out.d = 0;
      out.c = 0;
      ncnn::Extractor::extract(&ex,"fc",&out,0);
      pLVar3 = ncnn::create_layer("Softmax");
      ncnn::ParamDict::ParamDict(&pd);
      (*pLVar3->_vptr_Layer[2])(pLVar3,&pd);
      (*pLVar3->_vptr_Layer[9])(pLVar3,&out,&shufflenetv2.opt);
      (*pLVar3->_vptr_Layer[1])(pLVar3);
      ncnn::ParamDict::~ParamDict(&pd);
      ncnn::Mat::reshape((Mat *)&pd,&out,out.h * out.w * out.c,(Allocator *)0x0);
      ncnn::Mat::operator=(&out,(Mat *)&pd);
      ncnn::Mat::~Mat((Mat *)&pd);
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)out.w);
      uVar4 = 0;
      uVar6 = (ulong)(uint)out.w;
      if (out.w < 1) {
        uVar6 = uVar4;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar4] = *(float *)((long)out.data + uVar4 * 4);
      }
      ncnn::Mat::~Mat(&out);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&shufflenetv2);
      shufflenetv2.opt.blob_allocator = (Allocator *)0x0;
      shufflenetv2._vptr_Net = (_func_int **)0x0;
      shufflenetv2.opt.lightmode = false;
      shufflenetv2.opt._1_3_ = 0;
      shufflenetv2.opt.num_threads = 0;
      uVar6 = (ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar5 = (int)uVar6;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &shufflenetv2,(long)iVar5);
      uVar4 = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar5 < 1) {
        uVar6 = uVar4;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        *(float *)(shufflenetv2._vptr_Net + uVar4) =
             cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
        *(int *)((long)shufflenetv2._vptr_Net + uVar4 * 8 + 4) = (int)uVar4;
      }
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (shufflenetv2._vptr_Net,shufflenetv2._vptr_Net + 3,shufflenetv2.opt._0_8_);
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        fprintf(_stderr,"%d = %f\n",SUB84((double)*(float *)(shufflenetv2._vptr_Net + lVar7),0),
                (ulong)*(uint *)((long)shufflenetv2._vptr_Net + lVar7 * 8 + 4));
      }
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    &shufflenetv2);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cls_scores.super__Vector_base<float,_std::allocator<float>_>);
      iVar5 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar5 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_shufflenetv2(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}